

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O0

void __thiscall Table::load_escape_chars(Table *this,string *fname)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  string *local_18;
  string *fname_local;
  Table *this_local;
  
  local_18 = fname;
  fname_local = (string *)this;
  load(&local_48,fname);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->escape_chars,&local_48);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&local_48);
  return;
}

Assistant:

void Table::load_escape_chars(const std::string &fname) {
    this->escape_chars = load(fname);
}